

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int yaml_parser_process_directives
              (yaml_parser_t *parser,yaml_version_directive_t **version_directive_ref,
              yaml_tag_directive_t **tag_directives_start_ref,
              yaml_tag_directive_t **tag_directives_end_ref)

{
  anon_union_24_7_b8cffe5e_for_data *paVar1;
  yaml_char_t *pyVar2;
  yaml_tag_directive_t value;
  int iVar3;
  yaml_tag_directive_t *pyVar4;
  yaml_char_t *pyVar5;
  yaml_token_t *pyVar6;
  undefined **ppuVar7;
  yaml_tag_directive_t value_00;
  yaml_tag_directive_t *local_78;
  yaml_tag_directive_t *pyStack_70;
  yaml_tag_directive_t *pyStack_68;
  yaml_version_directive_t **local_60;
  size_t local_58;
  size_t sStack_50;
  size_t local_48;
  yaml_tag_directive_t **local_38;
  
  pyStack_70 = (yaml_tag_directive_t *)0x0;
  pyStack_68 = (yaml_tag_directive_t *)0x0;
  local_78 = (yaml_tag_directive_t *)yaml_malloc(0x100);
  if (local_78 == (yaml_tag_directive_t *)0x0) {
LAB_00107871:
    parser->error = YAML_MEMORY_ERROR;
  }
  else {
    pyStack_70 = local_78 + 0x10;
    pyStack_68 = local_78;
    if (((parser->token_available != 0) ||
        (iVar3 = yaml_parser_fetch_more_tokens(parser), iVar3 != 0)) &&
       (pyVar6 = (parser->tokens).head, local_38 = tag_directives_end_ref,
       pyVar6 != (yaml_token_t *)0x0)) {
      pyVar4 = (yaml_tag_directive_t *)0x0;
      local_60 = version_directive_ref;
      do {
        if (1 < pyVar6->type - YAML_VERSION_DIRECTIVE_TOKEN) {
          pyVar5 = "!";
          ppuVar7 = &PTR_anon_var_dwarf_4c33_00115dc0;
          goto LAB_001078d3;
        }
        if (pyVar6->type == YAML_VERSION_DIRECTIVE_TOKEN) {
          if (pyVar4 != (yaml_tag_directive_t *)0x0) {
            local_48 = (pyVar6->start_mark).column;
            local_58 = (pyVar6->start_mark).index;
            sStack_50 = (pyVar6->start_mark).line;
            parser->error = YAML_PARSER_ERROR;
            parser->problem = "found duplicate %YAML directive";
            (parser->problem_mark).index = local_58;
            (parser->problem_mark).line = sStack_50;
            (parser->problem_mark).column = local_48;
            goto LAB_0010787a;
          }
          if (((pyVar6->data).version_directive.major != 1) ||
             ((pyVar6->data).version_directive.minor != 1)) {
            local_48 = (pyVar6->start_mark).column;
            local_58 = (pyVar6->start_mark).index;
            sStack_50 = (pyVar6->start_mark).line;
            parser->error = YAML_PARSER_ERROR;
            parser->problem = "found incompatible YAML document";
            (parser->problem_mark).index = local_58;
            (parser->problem_mark).line = sStack_50;
            (parser->problem_mark).column = local_48;
            break;
          }
          pyVar4 = (yaml_tag_directive_t *)yaml_malloc(8);
          if (pyVar4 == (yaml_tag_directive_t *)0x0) goto LAB_00107871;
          *(yaml_encoding_t *)&pyVar4->handle = (pyVar6->data).stream_start.encoding;
          *(int *)((long)&pyVar4->handle + 4) = (pyVar6->data).version_directive.minor;
        }
        else {
          paVar1 = &pyVar6->data;
          pyVar5 = (paVar1->alias).value;
          pyVar2 = (pyVar6->data).tag.suffix;
          value.handle = *(yaml_char_t **)paVar1;
          value.prefix = *(yaml_char_t **)((long)&paVar1->tag + 8);
          iVar3 = yaml_parser_append_tag_directive(parser,value,0,pyVar6->start_mark);
          if (iVar3 == 0) goto LAB_0010787a;
          if ((pyStack_68 == pyStack_70) &&
             (iVar3 = yaml_stack_extend(&local_78,&pyStack_68,&pyStack_70), iVar3 == 0)) {
            parser->error = YAML_MEMORY_ERROR;
            goto LAB_0010787a;
          }
          pyStack_68->handle = pyVar5;
          pyStack_68->prefix = pyVar2;
          pyStack_68 = pyStack_68 + 1;
        }
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        pyVar6 = (parser->tokens).head;
        parser->stream_end_produced = (uint)(pyVar6->type == YAML_STREAM_END_TOKEN);
        (parser->tokens).head = pyVar6 + 1;
        iVar3 = yaml_parser_fetch_more_tokens(parser);
        if ((iVar3 == 0) || (pyVar6 = (parser->tokens).head, pyVar6 == (yaml_token_t *)0x0))
        goto LAB_0010787a;
      } while( true );
    }
  }
  pyVar4 = (yaml_tag_directive_t *)0x0;
LAB_0010787a:
  yaml_free(pyVar4);
  iVar3 = 0;
  while (pyVar4 = local_78, local_78 != pyStack_68) {
    pyVar4 = pyStack_68 + -1;
    pyVar5 = pyStack_68[-1].prefix;
    pyStack_68 = pyStack_68 + -1;
    yaml_free(pyVar4->handle);
    yaml_free(pyVar5);
  }
  goto LAB_00107a10;
  while( true ) {
    pyVar5 = *ppuVar7;
    ppuVar7 = ppuVar7 + 2;
    if (pyVar5 == (yaml_char_t *)0x0) break;
LAB_001078d3:
    value_00.prefix = ppuVar7[-1];
    value_00.handle = pyVar5;
    iVar3 = yaml_parser_append_tag_directive(parser,value_00,1,pyVar6->start_mark);
    if (iVar3 == 0) goto LAB_0010787a;
  }
  if (local_60 != (yaml_version_directive_t **)0x0) {
    *local_60 = (yaml_version_directive_t *)pyVar4;
  }
  if (tag_directives_start_ref == (yaml_tag_directive_t **)0x0) {
    yaml_free(local_78);
    local_78 = (yaml_tag_directive_t *)0x0;
    pyStack_70 = (yaml_tag_directive_t *)0x0;
    pyStack_68 = (yaml_tag_directive_t *)0x0;
  }
  else if (local_78 == pyStack_68) {
    *local_38 = (yaml_tag_directive_t *)0x0;
    *tag_directives_start_ref = (yaml_tag_directive_t *)0x0;
    yaml_free(local_78);
    pyStack_68 = (yaml_tag_directive_t *)0x0;
    local_78 = (yaml_tag_directive_t *)0x0;
    pyStack_70 = (yaml_tag_directive_t *)0x0;
  }
  else {
    *tag_directives_start_ref = local_78;
    *local_38 = pyStack_68;
  }
  iVar3 = 1;
  if (local_60 != (yaml_version_directive_t **)0x0) {
    return 1;
  }
LAB_00107a10:
  yaml_free(pyVar4);
  return iVar3;
}

Assistant:

static int
yaml_parser_process_directives(yaml_parser_t *parser,
        yaml_version_directive_t **version_directive_ref,
        yaml_tag_directive_t **tag_directives_start_ref,
        yaml_tag_directive_t **tag_directives_end_ref)
{
    yaml_tag_directive_t default_tag_directives[] = {
        {(yaml_char_t *)"!", (yaml_char_t *)"!"},
        {(yaml_char_t *)"!!", (yaml_char_t *)"tag:yaml.org,2002:"},
        {NULL, NULL}
    };
    yaml_tag_directive_t *default_tag_directive;
    yaml_version_directive_t *version_directive = NULL;
    struct {
        yaml_tag_directive_t *start;
        yaml_tag_directive_t *end;
        yaml_tag_directive_t *top;
    } tag_directives = { NULL, NULL, NULL };
    yaml_token_t *token;

    if (!STACK_INIT(parser, tag_directives, yaml_tag_directive_t*))
        goto error;

    token = PEEK_TOKEN(parser);
    if (!token) goto error;

    while (token->type == YAML_VERSION_DIRECTIVE_TOKEN ||
            token->type == YAML_TAG_DIRECTIVE_TOKEN)
    {
        if (token->type == YAML_VERSION_DIRECTIVE_TOKEN) {
            if (version_directive) {
                yaml_parser_set_parser_error(parser,
                        "found duplicate %YAML directive", token->start_mark);
                goto error;
            }
            if (token->data.version_directive.major != 1
                    || token->data.version_directive.minor != 1) {
                yaml_parser_set_parser_error(parser,
                        "found incompatible YAML document", token->start_mark);
                goto error;
            }
            version_directive = YAML_MALLOC_STATIC(yaml_version_directive_t);
            if (!version_directive) {
                parser->error = YAML_MEMORY_ERROR;
                goto error;
            }
            version_directive->major = token->data.version_directive.major;
            version_directive->minor = token->data.version_directive.minor;
        }

        else if (token->type == YAML_TAG_DIRECTIVE_TOKEN) {
            yaml_tag_directive_t value;
            value.handle = token->data.tag_directive.handle;
            value.prefix = token->data.tag_directive.prefix;

            if (!yaml_parser_append_tag_directive(parser, value, 0,
                        token->start_mark))
                goto error;
            if (!PUSH(parser, tag_directives, value))
                goto error;
        }

        SKIP_TOKEN(parser);
        token = PEEK_TOKEN(parser);
        if (!token) goto error;
    }

    for (default_tag_directive = default_tag_directives;
            default_tag_directive->handle; default_tag_directive++) {
        if (!yaml_parser_append_tag_directive(parser, *default_tag_directive, 1,
                    token->start_mark))
            goto error;
    }

    if (version_directive_ref) {
        *version_directive_ref = version_directive;
    }
    if (tag_directives_start_ref) {
        if (STACK_EMPTY(parser, tag_directives)) {
            *tag_directives_start_ref = *tag_directives_end_ref = NULL;
            STACK_DEL(parser, tag_directives);
        }
        else {
            *tag_directives_start_ref = tag_directives.start;
            *tag_directives_end_ref = tag_directives.top;
        }
    }
    else {
        STACK_DEL(parser, tag_directives);
    }

    if (!version_directive_ref)
        yaml_free(version_directive);
    return 1;

error:
    yaml_free(version_directive);
    while (!STACK_EMPTY(parser, tag_directives)) {
        yaml_tag_directive_t tag_directive = POP(parser, tag_directives);
        yaml_free(tag_directive.handle);
        yaml_free(tag_directive.prefix);
    }
    STACK_DEL(parser, tag_directives);
    return 0;
}